

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_4ec2e9::BNTest_MPI_Test::TestBody(BNTest_MPI_Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  pointer message;
  BIGNUM *in_R9;
  BIGNUM *expected_predicate_value;
  ScopedTrace gtest_trace_1269;
  size_t mpi_len;
  UniquePtr<BIGNUM> bn2;
  UniquePtr<BIGNUM> bn;
  uint8_t scratch [8];
  size_t mpi_len2;
  ScopedTrace local_a1;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  AssertHelper local_70;
  Bytes local_68;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_58;
  AssertHelper local_50;
  AssertHelper local_48;
  uchar local_40 [8];
  unsigned_long local_38;
  
  lVar2 = 0x10;
  while( true ) {
    pcVar3 = *(char **)((long)&PTR_typeinfo_006d56e0 + lVar2);
    testing::ScopedTrace::ScopedTrace
              (&local_a1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x4f5,pcVar3);
    local_90 = (undefined1  [8])0x0;
    iVar1 = BN_asc2bn((BIGNUM **)local_90,pcVar3);
    local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)local_90;
    if (iVar1 == 0) {
      local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
    local_a0[0] = (tuple<bignum_st_*,_bssl::internal::Deleter>)
                  local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                  (_Head_base<0UL,_bignum_st_*,_false>)0x0;
    pbStack_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
        local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_st_*,_false>)0x0) break;
    iVar1 = BN_bn2mpi((BIGNUM *)
                      local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(uchar *)0x0);
    local_70.data_ = (AssertHelperData *)CONCAT44(extraout_var,iVar1);
    local_a0 = (undefined1  [8])0x8;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_90,"mpi_len","sizeof(scratch)",(unsigned_long *)&local_70,
               (unsigned_long *)local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_a0 + 0x10),"MPI size is too large to test",0x1d);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4fa,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_002b087f;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_88;
      goto LAB_002b087a;
    }
    expected_predicate_value = in_R9;
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
      expected_predicate_value = in_R9;
    }
    iVar1 = BN_bn2mpi((BIGNUM *)
                      local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,local_40);
    local_38 = CONCAT44(extraout_var_00,iVar1);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_90,"mpi_len","mpi_len2",(unsigned_long *)&local_70,&local_38);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      pcVar3 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4fd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    local_a0 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)(&UNK_006d56e8 + lVar2))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbStack_98 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&(anonymous_namespace)::kMPITests + lVar2);
    local_68.span_.data_ = local_40;
    local_68.span_.size_ = (size_t)local_70.data_;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_90,"Bytes(test.mpi, test.mpi_len)","Bytes(scratch, mpi_len)",
               (Bytes *)local_a0,&local_68);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      pcVar3 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4fe,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    in_R9 = BN_mpi2bn(local_40,(int)local_70.data_,(BIGNUM *)0x0);
    local_a0[0] = in_R9 != (BIGNUM *)0x0;
    pbStack_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.span_.data_ = (uchar *)in_R9;
    if (in_R9 == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_50.data_)->line,"failed to parse",0xf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)local_a0,(AssertionResult *)"bn2","false","true",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x501,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      if (pbStack_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_98,pbStack_98);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_68);
      goto LAB_002b087f;
    }
    AssertBIGNUMSEqual(local_90,"bn.get()","bn2.get()","BN_mpi2bn",
                       (BIGNUM *)
                       local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BIGNUM *)in_R9);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      pcVar3 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x502,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_68);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
    testing::ScopedTrace::~ScopedTrace(&local_a1);
    lVar2 = lVar2 + 0x18;
    if (lVar2 == 0xa0) {
      return;
    }
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_90,(internal *)local_a0,(AssertionResult *)0x53c60c,"false","true",
             (char *)in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
             ,0x4f7,(char *)local_90);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
  }
  if ((BIGNUM *)local_68.span_.data_ != (BIGNUM *)0x0) {
    (*(code *)(*(ulong **)local_68.span_.data_)[1])();
  }
  if (pbStack_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  goto LAB_002b087f;
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pbStack_98;
  local_88 = pbStack_98;
LAB_002b087a:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_88);
LAB_002b087f:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
  testing::ScopedTrace::~ScopedTrace(&local_a1);
  return;
}

Assistant:

TEST_F(BNTest, MPI) {
  uint8_t scratch[8];

  for (const auto &test : kMPITests) {
    SCOPED_TRACE(test.base10);
    bssl::UniquePtr<BIGNUM> bn(ASCIIToBIGNUM(test.base10));
    ASSERT_TRUE(bn);

    const size_t mpi_len = BN_bn2mpi(bn.get(), NULL);
    ASSERT_LE(mpi_len, sizeof(scratch)) << "MPI size is too large to test";

    const size_t mpi_len2 = BN_bn2mpi(bn.get(), scratch);
    EXPECT_EQ(mpi_len, mpi_len2);
    EXPECT_EQ(Bytes(test.mpi, test.mpi_len), Bytes(scratch, mpi_len));

    bssl::UniquePtr<BIGNUM> bn2(BN_mpi2bn(scratch, mpi_len, NULL));
    ASSERT_TRUE(bn2) << "failed to parse";
    EXPECT_BIGNUMS_EQUAL("BN_mpi2bn", bn.get(), bn2.get());
  }
}